

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

bool __thiscall
Lib::Set<Kernel::OperatorType*,Kernel::OperatorType::TypeHash>::find<Kernel::OperatorType*>
          (Set<Kernel::OperatorType_*,_Kernel::OperatorType::TypeHash> *this,OperatorType *key,
          OperatorType **result)

{
  bool bVar1;
  OperatorType *t1;
  undefined8 *in_RDX;
  Set<Kernel::OperatorType_*,_Kernel::OperatorType::TypeHash> *in_RDI;
  Cell *cell;
  uint code;
  OperatorType *in_stack_ffffffffffffffd0;
  uint local_24;
  
  local_24 = Kernel::OperatorType::TypeHash::hash(in_stack_ffffffffffffffd0);
  if (local_24 < 2) {
    local_24 = 2;
  }
  t1 = (OperatorType *)
       Set<Kernel::OperatorType_*,_Kernel::OperatorType::TypeHash>::firstCellForCode
                 (in_RDI,local_24);
  while( true ) {
    bVar1 = Set<Kernel::OperatorType_*,_Kernel::OperatorType::TypeHash>::Cell::empty((Cell *)t1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    bVar1 = Set<Kernel::OperatorType_*,_Kernel::OperatorType::TypeHash>::Cell::deleted((Cell *)t1);
    if (((!bVar1) && (*(uint *)&t1->_key == local_24)) &&
       (bVar1 = Kernel::OperatorType::TypeHash::equals(t1,(OperatorType *)in_RDI), bVar1)) break;
    t1 = (OperatorType *)
         Set<Kernel::OperatorType_*,_Kernel::OperatorType::TypeHash>::nextCell(in_RDI,(Cell *)t1);
  }
  *in_RDX = *(undefined8 *)&t1->_typeArgsArity;
  return true;
}

Assistant:

bool find(Key key, Val& result) const
  {
    unsigned code = Hash::hash(key);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,key)) {
	result=cell->value;
	return true;
      }
    }
    return false;
  }